

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::output_three_particle_correlation(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  reference pvVar5;
  void *pvVar6;
  string *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double Cnmk_os_13_err;
  double Cnmk_os_13_stdsq;
  double Cnmk_os_13_avg;
  double Cnmk_os_err;
  double Cnmk_os_stdsq;
  double Cnmk_os_avg;
  int i_2;
  double num_pair_os_13_err;
  double num_pair_os_13_stdsq;
  double num_pair_os_13;
  double num_pair_os_err;
  double num_pair_os_stdsq;
  double num_pair_os;
  ofstream output_os;
  ostringstream filename_os;
  double Cnmk_ss_13_err;
  double Cnmk_ss_13_stdsq;
  double Cnmk_ss_13_avg;
  double Cnmk_ss_err;
  double Cnmk_ss_stdsq;
  double Cnmk_ss_avg;
  int i_1;
  double num_pair_ss_13_err;
  double num_pair_ss_13_stdsq;
  double num_pair_ss_13;
  double num_pair_ss_err;
  double num_pair_ss_stdsq;
  double num_pair_ss;
  ofstream output_ss;
  ostringstream filename_ss;
  double Cnmk_err;
  double Cnmk_stdsq;
  double Cnmk_avg;
  int i;
  double num_pair_err;
  double num_pair_stdsq;
  double num_pair;
  ofstream output;
  ostringstream filename;
  double local_c10;
  double local_bf8;
  int local_bdc;
  double local_bd0;
  double local_bb8;
  string local_ba0 [32];
  ostream local_b80 [512];
  ostringstream local_980 [376];
  int local_808;
  int local_804;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d8;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  string local_790 [32];
  ostream local_770 [512];
  ostringstream local_570 [376];
  int local_3f8;
  int local_3f4;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  string local_3b0 [32];
  ostream local_390 [528];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  if (*(int *)(in_RDI + 0x238) == 0) {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk");
    poVar3 = std::operator<<(poVar3,"_eta_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk");
    poVar3 = std::operator<<(poVar3,"_y_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_390,pcVar4,_S_out);
  std::__cxx11::string::~string(local_3b0);
  poVar3 = std::operator<<(local_390,"# n  C_nmk  C_nmk_err");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x540),0);
  local_3b8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x558),0);
  local_3c0 = -local_3b8 * local_3b8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  local_3c8 = 0.0;
  if (0.0 < local_3c0) {
    local_3c8 = sqrt(local_3c0 / (double)*(int *)(in_RDI + 0x2f8));
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
  local_3cc = (int)std::setw(0x12);
  poVar3 = std::operator<<(poVar3,(_Setw)local_3cc);
  local_3d0 = (int)std::setprecision(8);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_3d0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3b8);
  poVar3 = std::operator<<(poVar3,"  ");
  pvVar6 = (void *)std::ostream::operator<<(poVar3,local_3c8);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  for (local_3d4 = 1; local_3d4 < *(int *)(in_RDI + 0x538); local_3d4 = local_3d4 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x540),(long)local_3d4)
    ;
    local_3e0 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x558),(long)local_3d4)
    ;
    local_3e8 = -local_3e0 * local_3e0 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_3e0 = local_3e0 / local_3b8;
    local_3f0 = 0.0;
    if (0.0 < local_3e8) {
      local_3f0 = sqrt(local_3e8 / (double)*(int *)(in_RDI + 0x2f8));
      local_3f0 = local_3f0 / local_3b8;
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
    local_3f4 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_3f4);
    local_3f8 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_3f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3e0);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar6 = (void *)std::ostream::operator<<(poVar3,local_3f0);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  if (*(int *)(in_RDI + 0x5d0) == 1) {
    std::__cxx11::ostringstream::ostringstream(local_570);
    if (*(int *)(in_RDI + 0x238) == 0) {
      poVar3 = std::operator<<((ostream *)local_570,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cmnk_ss_eta_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    else {
      poVar3 = std::operator<<((ostream *)local_570,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cmnk_ss_y_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_770,pcVar4,_S_out);
    std::__cxx11::string::~string(local_790);
    poVar3 = std::operator<<(local_770,"# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5d8),0);
    local_798 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5f0),0);
    local_7a0 = -local_798 * local_798 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_7a8 = 0.0;
    if (0.0 < local_7a0) {
      local_7a8 = sqrt(local_7a0 / (double)*(int *)(in_RDI + 0x2f8));
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),0);
    local_7b0 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x650),0);
    local_7b8 = -local_7b0 * local_7b0 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_7c0 = 0.0;
    if (0.0 < local_7b8) {
      local_7c0 = sqrt(local_7b8 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_770,std::scientific);
    local_7c4 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_7c4);
    local_7c8 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_7c8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_798);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7a8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7b0);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar6 = (void *)std::ostream::operator<<(poVar3,local_7c0);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    for (local_7cc = 1; local_7cc < *(int *)(in_RDI + 0x538); local_7cc = local_7cc + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5d8),
                          (long)local_7cc);
      local_7d8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5f0),
                          (long)local_7cc);
      local_7e0 = -local_7d8 * local_7d8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      local_7d8 = local_7d8 / local_798;
      local_7e8 = 0.0;
      if (0.0 < local_7e0) {
        local_7e8 = sqrt(local_7e0 / (double)*(int *)(in_RDI + 0x2f8));
        local_7e8 = local_7e8 / local_798;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),
                          (long)local_7cc);
      local_7f0 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x650),
                          (long)local_7cc);
      local_7f8 = -local_7f0 * local_7f0 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      local_7f0 = local_7f0 / local_7b0;
      local_800 = 0.0;
      if (0.0 < local_7f8) {
        local_800 = sqrt(local_7f8 / (double)*(int *)(in_RDI + 0x2f8));
        local_800 = local_800 / local_7b0;
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_770,std::scientific);
      local_804 = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_804);
      local_808 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_808);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7cc);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7d8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7e8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7f0);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar6 = (void *)std::ostream::operator<<(poVar3,local_800);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::ostringstream::ostringstream(local_980);
    if (*(int *)(in_RDI + 0x238) == 0) {
      poVar3 = std::operator<<((ostream *)local_980,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cmnk_os_eta_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    else {
      poVar3 = std::operator<<((ostream *)local_980,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cmnk_os_y_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_b80,pcVar4,_S_out);
    std::__cxx11::string::~string(local_ba0);
    poVar3 = std::operator<<(local_b80,"# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x608),0);
    dVar7 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x620),0);
    dVar8 = -dVar7 * dVar7 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_bb8 = 0.0;
    if (0.0 < dVar8) {
      local_bb8 = sqrt(dVar8 / (double)*(int *)(in_RDI + 0x2f8));
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x668),0);
    dVar8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x680),0);
    dVar9 = -dVar8 * dVar8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_bd0 = 0.0;
    if (0.0 < dVar9) {
      local_bd0 = sqrt(dVar9 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_b80,std::scientific);
    _Var1 = std::setw(0x12);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bb8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar6 = (void *)std::ostream::operator<<(poVar3,local_bd0);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    for (local_bdc = 1; local_bdc < *(int *)(in_RDI + 0x538); local_bdc = local_bdc + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x608),
                          (long)local_bdc);
      dVar9 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x620),
                          (long)local_bdc);
      dVar10 = -dVar9 * dVar9 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      local_bf8 = 0.0;
      if (0.0 < dVar10) {
        local_bf8 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
        local_bf8 = local_bf8 / dVar7;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x668),
                          (long)local_bdc);
      dVar10 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x680),
                          (long)local_bdc);
      dVar11 = -dVar10 * dVar10 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      local_c10 = 0.0;
      if (0.0 < dVar11) {
        local_c10 = sqrt(dVar11 / (double)*(int *)(in_RDI + 0x2f8));
        local_c10 = local_c10 / dVar8;
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_b80,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bdc);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9 / dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bf8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar10 / dVar8);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar6 = (void *)std::ostream::operator<<(poVar3,local_c10);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::~ofstream(local_b80);
    std::__cxx11::ostringstream::~ostringstream(local_980);
    std::ofstream::~ofstream(local_770);
    std::__cxx11::ostringstream::~ostringstream(local_570);
  }
  std::ofstream::~ofstream(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  C_nmk  C_nmk_err" << endl;

    double num_pair = C_nmk[0] / total_number_of_events;
    double num_pair_stdsq =
        (C_nmk_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_corr; i++) {
        double Cnmk_avg = C_nmk[i] / total_number_of_events;
        double Cnmk_stdsq =
            (C_nmk_err[i] / total_number_of_events - Cnmk_avg * Cnmk_avg);
        Cnmk_avg = Cnmk_avg / num_pair;
        double Cnmk_err = 0.0;
        if (Cnmk_stdsq > 0) {
            Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
            Cnmk_err = Cnmk_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cnmk_avg << "  " << Cnmk_err << endl;
    }
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        output_ss << "# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err"
                  << endl;

        double num_pair_ss = C_nmk_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (C_nmk_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        double num_pair_ss_13 = C_nmk_ss_13[0] / total_number_of_events;
        double num_pair_ss_13_stdsq =
            (C_nmk_ss_13_err[0] / total_number_of_events
             - num_pair_ss_13 * num_pair_ss_13);
        double num_pair_ss_13_err = 0.0;
        if (num_pair_ss_13_stdsq > 0) {
            num_pair_ss_13_err =
                sqrt(num_pair_ss_13_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss_13 << "  " << num_pair_ss_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_ss_avg = C_nmk_ss[i] / total_number_of_events;
            double Cnmk_ss_stdsq =
                (C_nmk_ss_err[i] / total_number_of_events
                 - Cnmk_ss_avg * Cnmk_ss_avg);
            Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
            double Cnmk_ss_err = 0.0;
            if (Cnmk_ss_stdsq > 0) {
                Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
            }
            double Cnmk_ss_13_avg = C_nmk_ss_13[i] / total_number_of_events;
            double Cnmk_ss_13_stdsq =
                (C_nmk_ss_13_err[i] / total_number_of_events
                 - Cnmk_ss_13_avg * Cnmk_ss_13_avg);
            Cnmk_ss_13_avg = Cnmk_ss_13_avg / num_pair_ss_13;
            double Cnmk_ss_13_err = 0.0;
            if (Cnmk_ss_13_stdsq > 0) {
                Cnmk_ss_13_err =
                    sqrt(Cnmk_ss_13_stdsq / total_number_of_events);
                Cnmk_ss_13_err = Cnmk_ss_13_err / num_pair_ss_13;
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  "
                      << Cnmk_ss_13_avg << "  " << Cnmk_ss_13_err << endl;
        }
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_os(filename_os.str().c_str());
        output_os << "# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err"
                  << endl;

        double num_pair_os = C_nmk_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (C_nmk_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        double num_pair_os_13 = C_nmk_os_13[0] / total_number_of_events;
        double num_pair_os_13_stdsq =
            (C_nmk_os_13_err[0] / total_number_of_events
             - num_pair_os_13 * num_pair_os_13);
        double num_pair_os_13_err = 0.0;
        if (num_pair_os_13_stdsq > 0) {
            num_pair_os_13_err =
                sqrt(num_pair_os_13_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os_13 << "  " << num_pair_os_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_os_avg = C_nmk_os[i] / total_number_of_events;
            double Cnmk_os_stdsq =
                (C_nmk_os_err[i] / total_number_of_events
                 - Cnmk_os_avg * Cnmk_os_avg);
            Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
            double Cnmk_os_err = 0.0;
            if (Cnmk_os_stdsq > 0) {
                Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                Cnmk_os_err = Cnmk_os_err / num_pair_os;
            }
            double Cnmk_os_13_avg = C_nmk_os_13[i] / total_number_of_events;
            double Cnmk_os_13_stdsq =
                (C_nmk_os_13_err[i] / total_number_of_events
                 - Cnmk_os_13_avg * Cnmk_os_13_avg);
            Cnmk_os_13_avg = Cnmk_os_13_avg / num_pair_os_13;
            double Cnmk_os_13_err = 0.0;
            if (Cnmk_os_13_stdsq > 0) {
                Cnmk_os_13_err =
                    sqrt(Cnmk_os_13_stdsq / total_number_of_events);
                Cnmk_os_13_err = Cnmk_os_13_err / num_pair_os_13;
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_os_avg << "  " << Cnmk_os_err << "  "
                      << Cnmk_os_13_avg << "  " << Cnmk_os_13_err << endl;
        }
    }
}